

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O1

int bsdtar_getopt(bsdtar *bsdtar)

{
  char cVar1;
  char **ppcVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  bsdtar_option *pbVar8;
  bsdtar_option *pbVar9;
  size_t __n;
  uint __c;
  bsdtar_option *pbVar10;
  bsdtar_option *pbVar11;
  char *pcVar12;
  bsdtar_option *pbVar13;
  
  pcVar12 = "--";
  while( true ) {
    bsdtar->argument = (char *)0x0;
    if (bsdtar->getopt_state == 0) {
      ppcVar2 = bsdtar->argv;
      bsdtar->argv = ppcVar2 + 1;
      iVar3 = bsdtar->argc;
      bsdtar->argc = iVar3 + -1;
      if (ppcVar2[1] == (char *)0x0) {
        return -1;
      }
      if (*ppcVar2[1] == '-') {
        bsdtar->getopt_state = 2;
      }
      else {
        bsdtar->getopt_state = 1;
        bsdtar->argv = ppcVar2 + 2;
        bsdtar->getopt_word = ppcVar2[1];
        bsdtar->argc = iVar3 + -2;
      }
    }
    __c = 0x3f;
    if (bsdtar->getopt_state == 1) {
      pcVar5 = bsdtar->getopt_word;
      bsdtar->getopt_word = pcVar5 + 1;
      cVar1 = *pcVar5;
      __c = (uint)cVar1;
      if (cVar1 == '\0') {
        bsdtar->getopt_state = 2;
        __c = 0;
      }
      else {
        pvVar4 = memchr("aBb:C:cf:HhI:JjkLlmnOoPpqrSs:T:tUuvW:wX:xyZz",__c,0x2d);
        if (pvVar4 == (void *)0x0) {
          return 0x3f;
        }
        if (*(char *)((long)pvVar4 + 1) == ':') {
          pcVar5 = *bsdtar->argv;
          bsdtar->argument = pcVar5;
          if (pcVar5 == (char *)0x0) {
            pcVar12 = "Option %c requires an argument";
            goto LAB_0011029a;
          }
          bsdtar->argv = bsdtar->argv + 1;
          bsdtar->argc = bsdtar->argc + -1;
        }
      }
    }
    if (bsdtar->getopt_state == 2) {
      ppcVar2 = bsdtar->argv;
      pcVar5 = *ppcVar2;
      if (pcVar5 == (char *)0x0) {
        return -1;
      }
      if (*pcVar5 != '-') {
        return -1;
      }
      iVar3 = strcmp(pcVar5,"--");
      bsdtar->argv = ppcVar2 + 1;
      if (iVar3 == 0) {
        bsdtar->argc = bsdtar->argc + -1;
        return -1;
      }
      pcVar5 = *ppcVar2;
      bsdtar->getopt_word = pcVar5;
      bsdtar->argc = bsdtar->argc + -1;
      if (pcVar5[1] == '-') {
        bsdtar->getopt_state = 4;
        pcVar5 = pcVar5 + 2;
      }
      else {
        pcVar5 = pcVar5 + 1;
        bsdtar->getopt_state = 3;
      }
      bsdtar->getopt_word = pcVar5;
    }
    if (bsdtar->getopt_state != 3) goto LAB_00110117;
    pcVar6 = bsdtar->getopt_word;
    pcVar5 = pcVar6 + 1;
    bsdtar->getopt_word = pcVar5;
    cVar1 = *pcVar6;
    __c = (uint)cVar1;
    if (cVar1 != '\0') break;
    bsdtar->getopt_state = 2;
  }
  pvVar4 = memchr("aBb:C:cf:HhI:JjkLlmnOoPpqrSs:T:tUuvW:wX:xyZz",__c,0x2d);
  if (pvVar4 == (void *)0x0) {
    return 0x3f;
  }
  if (*(char *)((long)pvVar4 + 1) == ':') {
    if (*pcVar5 == '\0') {
      pcVar5 = *bsdtar->argv;
      bsdtar->getopt_word = pcVar5;
      if (pcVar5 == (char *)0x0) {
        pcVar12 = "Option -%c requires an argument";
LAB_0011029a:
        lafe_warnc(0,pcVar12,(ulong)__c);
        return 0x3f;
      }
      bsdtar->argv = bsdtar->argv + 1;
      bsdtar->argc = bsdtar->argc + -1;
    }
    if (cVar1 == 'W') {
      bsdtar->getopt_state = 4;
      __c = 0x57;
      pcVar12 = "-W ";
    }
    else {
      bsdtar->getopt_state = 2;
      bsdtar->argument = bsdtar->getopt_word;
    }
  }
LAB_00110117:
  if (bsdtar->getopt_state != 4) {
    return __c;
  }
  bsdtar->getopt_state = 2;
  pcVar5 = bsdtar->getopt_word;
  pcVar6 = strchr(pcVar5,0x3d);
  if (pcVar6 == (char *)0x0) {
    __n = strlen(pcVar5);
  }
  else {
    __n = (long)pcVar6 - (long)pcVar5;
    bsdtar->argument = pcVar6 + 1;
  }
  cVar1 = *pcVar5;
  pcVar6 = "absolute-paths";
  pbVar11 = (bsdtar_option *)0x0;
  pbVar10 = tar_longopts;
  pbVar13 = (bsdtar_option *)0x0;
  do {
    pbVar9 = pbVar10;
    pbVar8 = pbVar13;
    if (((*pcVar6 == cVar1) && (iVar3 = strncmp(pcVar5,pcVar6,__n), iVar3 == 0)) &&
       (sVar7 = strlen(pcVar6), pbVar8 = pbVar9, pbVar11 = pbVar13, sVar7 == __n)) {
      pbVar11 = (bsdtar_option *)0x0;
      break;
    }
    pcVar6 = pbVar9[1].name;
    pbVar10 = pbVar9 + 1;
    pbVar9 = pbVar8;
    pbVar13 = pbVar8;
  } while (pcVar6 != (char *)0x0);
  if (pbVar9 != (bsdtar_option *)0x0) {
    if (pbVar11 != (bsdtar_option *)0x0) {
      lafe_warnc(0,"Ambiguous option %s%s (matches --%s and --%s)",pcVar12,pcVar5,pbVar9->name,
                 pbVar11->name);
      return 0x3f;
    }
    if (pbVar9->required == 0) {
      if (bsdtar->argument != (char *)0x0) {
        pcVar5 = pbVar9->name;
        pcVar6 = "Option %s%s does not allow an argument";
        goto LAB_00110226;
      }
    }
    else if (bsdtar->argument == (char *)0x0) {
      pcVar5 = *bsdtar->argv;
      bsdtar->argument = pcVar5;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = pbVar9->name;
        pcVar6 = "Option %s%s requires an argument";
        goto LAB_00110226;
      }
      bsdtar->argv = bsdtar->argv + 1;
      bsdtar->argc = bsdtar->argc + -1;
    }
    return pbVar9->equivalent;
  }
  pcVar6 = "Option %s%s is not supported";
LAB_00110226:
  lafe_warnc(0,pcVar6,pcVar12,pcVar5);
  return 0x3f;
}

Assistant:

int
bsdtar_getopt(struct bsdtar *bsdtar)
{
	enum { state_start = 0, state_old_tar, state_next_word,
	       state_short, state_long };

	const struct bsdtar_option *popt, *match = NULL, *match2 = NULL;
	const char *p, *long_prefix = "--";
	size_t optlength;
	int opt = '?';
	int required = 0;

	bsdtar->argument = NULL;

	/* First time through, initialize everything. */
	if (bsdtar->getopt_state == state_start) {
		/* Skip program name. */
		++bsdtar->argv;
		--bsdtar->argc;
		if (*bsdtar->argv == NULL)
			return (-1);
		/* Decide between "new style" and "old style" arguments. */
		if (bsdtar->argv[0][0] == '-') {
			bsdtar->getopt_state = state_next_word;
		} else {
			bsdtar->getopt_state = state_old_tar;
			bsdtar->getopt_word = *bsdtar->argv++;
			--bsdtar->argc;
		}
	}

	/*
	 * We're parsing old-style tar arguments
	 */
	if (bsdtar->getopt_state == state_old_tar) {
		/* Get the next option character. */
		opt = *bsdtar->getopt_word++;
		if (opt == '\0') {
			/* New-style args can follow old-style. */
			bsdtar->getopt_state = state_next_word;
		} else {
			/* See if it takes an argument. */
			p = strchr(short_options, opt);
			if (p == NULL)
				return ('?');
			if (p[1] == ':') {
				bsdtar->argument = *bsdtar->argv;
				if (bsdtar->argument == NULL) {
					lafe_warnc(0,
					    "Option %c requires an argument",
					    opt);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
		}
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (bsdtar->getopt_state == state_next_word) {
		/* No more arguments, so no more options. */
		if (bsdtar->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (bsdtar->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(bsdtar->argv[0], "--") == 0) {
			++bsdtar->argv;
			--bsdtar->argc;
			return (-1);
		}
		/* Get next word for parsing. */
		bsdtar->getopt_word = *bsdtar->argv++;
		--bsdtar->argc;
		if (bsdtar->getopt_word[1] == '-') {
			/* Set up long option parser. */
			bsdtar->getopt_state = state_long;
			bsdtar->getopt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			bsdtar->getopt_state = state_short;
			++bsdtar->getopt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (bsdtar->getopt_state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *bsdtar->getopt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			bsdtar->getopt_state = state_next_word;
			return bsdtar_getopt(bsdtar);
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, bsdtar->getopt_word already points to it. */
			if (bsdtar->getopt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				bsdtar->getopt_word = *bsdtar->argv;
				if (bsdtar->getopt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
			if (opt == 'W') {
				bsdtar->getopt_state = state_long;
				long_prefix = "-W "; /* For clearer errors. */
			} else {
				bsdtar->getopt_state = state_next_word;
				bsdtar->argument = bsdtar->getopt_word;
			}
		}
	}

	/* We're reading a long option, including -W long=arg convention. */
	if (bsdtar->getopt_state == state_long) {
		/* After this long option, we'll be starting a new word. */
		bsdtar->getopt_state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(bsdtar->getopt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - bsdtar->getopt_word);
			bsdtar->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(bsdtar->getopt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = tar_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != bsdtar->getopt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(bsdtar->getopt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, bsdtar->getopt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, bsdtar->getopt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (bsdtar->argument == NULL) {
				bsdtar->argument = *bsdtar->argv;
				if (bsdtar->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (bsdtar->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}